

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance> *this
          ,Context *context)

{
  TextureCubeShadowTestInstance *this_00;
  Context *context_local;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance> *this_local;
  
  this_00 = (TextureCubeShadowTestInstance *)operator_new(0x288);
  texture::anon_unknown_0::TextureCubeShadowTestInstance::TextureCubeShadowTestInstance
            (this_00,context,&this->m_testsParameters);
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}